

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PollerEpoll.cpp
# Opt level: O2

void __thiscall Liby::PollerEpoll::addChanel(PollerEpoll *this,Channel *ch)

{
  int iVar1;
  Logger *this_00;
  int *piVar2;
  undefined8 *puVar3;
  char *pcVar4;
  long lVar5;
  double __x;
  uint local_24;
  int local_20;
  
  if (ch != (Channel *)0x0) {
    local_20 = ch->fd_;
    lVar5 = (long)local_20;
    if (-1 < lVar5) {
      local_24 = ch->readable_ | 0x2010;
      if (ch->writable_ == true) {
        local_24 = ch->readable_ | 0x2014;
      }
      iVar1 = epoll_ctl(this->pollerfd_,1,local_20,(epoll_event *)&local_24);
      if (-1 < iVar1) {
        (this->super_Poller).channels_.
        super__Vector_base<Liby::Channel_*,_std::allocator<Liby::Channel_*>_>._M_impl.
        super__Vector_impl_data._M_start[lVar5] = ch;
        this->eventsSize_ = this->eventsSize_ + 1;
        this_00 = Logger::getLogger();
        Logger::log(this_00,__x);
        return;
      }
      piVar2 = __errno_location();
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      pcVar4 = strerror(*piVar2);
      *puVar3 = pcVar4;
      __cxa_throw(puVar3,&char*::typeinfo,0);
    }
  }
  __assert_fail("ch && ch->get_fd() >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/PollerEpoll.cpp"
                ,0x3c,"virtual void Liby::PollerEpoll::addChanel(Channel *)");
}

Assistant:

void PollerEpoll::addChanel(Channel *ch) {
    assert(ch && ch->get_fd() >= 0);

    int fd = ch->get_fd();
    struct epoll_event event;
    event.data.fd = fd;
    event.events = EPOLLHUP | EPOLLRDHUP;

    if (ch->readable()) {
        event.events |= EPOLLIN;
    }

    if (ch->writable()) {
        event.events |= EPOLLOUT;
    }

    int ret = ::epoll_ctl(pollerfd_, EPOLL_CTL_ADD, fd, &event);

    if (ret < 0) {
        auto it = errno;
        ClearUnuseVariableWarning(it);
        throw ::strerror(errno);
    } else {
        setChannel(fd, ch);
        eventsSize_++;
    }

    verbose("add channel fd = %d", ch->get_fd());
}